

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_call_error_callback(nghttp2_session *session,int lib_error_code,char *fmt,...)

{
  int iVar1;
  char *__s;
  char *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  nghttp2_mem *mem;
  int rv;
  char *buf;
  va_list ap;
  size_t bufsize;
  void *in_stack_fffffffffffffee8;
  nghttp2_mem *in_stack_fffffffffffffef0;
  int local_54;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  size_t local_28;
  char *local_20;
  undefined4 local_14;
  long local_10;
  int local_4;
  
  local_38 = &stack0xfffffffffffffee8;
  if ((*(long *)(in_RDI + 0x9f8) == 0) && (*(long *)(in_RDI + 0xa00) == 0)) {
    local_4 = 0;
  }
  else {
    local_40 = &stack0x00000008;
    local_44 = 0x30;
    local_48 = 0x18;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    iVar1 = vsnprintf((char *)0x0,0,in_RDX,&local_48);
    if (iVar1 < 0) {
      local_4 = -0x385;
    }
    else {
      local_28 = (size_t)(iVar1 + 1);
      __s = (char *)nghttp2_mem_malloc(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
      if (__s == (char *)0x0) {
        local_4 = -0x385;
      }
      else {
        local_40 = &stack0x00000008;
        local_44 = 0x30;
        local_48 = 0x18;
        local_38 = &stack0xfffffffffffffee8;
        iVar1 = vsnprintf(__s,local_28,local_20,&local_48);
        if (iVar1 < 0) {
          nghttp2_mem_free(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          local_4 = 0;
        }
        else {
          if (*(long *)(local_10 + 0xa00) == 0) {
            local_54 = (**(code **)(local_10 + 0x9f8))
                                 (local_10,__s,(long)iVar1,*(undefined8 *)(local_10 + 0xa30));
          }
          else {
            local_54 = (**(code **)(local_10 + 0xa00))
                                 (local_10,local_14,__s,(long)iVar1,
                                  *(undefined8 *)(local_10 + 0xa30));
          }
          nghttp2_mem_free(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          if (local_54 == 0) {
            local_4 = 0;
          }
          else {
            local_4 = -0x386;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int session_call_error_callback(nghttp2_session *session,
                                       int lib_error_code, const char *fmt,
                                       ...) {
  size_t bufsize;
  va_list ap;
  char *buf;
  int rv;
  nghttp2_mem *mem;

  if (!session->callbacks.error_callback &&
      !session->callbacks.error_callback2) {
    return 0;
  }

  mem = &session->mem;

  va_start(ap, fmt);
  rv = vsnprintf(NULL, 0, fmt, ap);
  va_end(ap);

  if (rv < 0) {
    return NGHTTP2_ERR_NOMEM;
  }

  bufsize = (size_t)(rv + 1);

  buf = nghttp2_mem_malloc(mem, bufsize);
  if (buf == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  va_start(ap, fmt);
  rv = vsnprintf(buf, bufsize, fmt, ap);
  va_end(ap);

  if (rv < 0) {
    nghttp2_mem_free(mem, buf);
    /* vsnprintf may return error because of various things we can
       imagine, but typically we don't want to drop session just for
       debug callback. */
    DEBUGF("error_callback: vsnprintf failed. The template was %s\n", fmt);
    return 0;
  }

  if (session->callbacks.error_callback2) {
    rv = session->callbacks.error_callback2(session, lib_error_code, buf,
                                            (size_t)rv, session->user_data);
  } else {
    rv = session->callbacks.error_callback(session, buf, (size_t)rv,
                                           session->user_data);
  }

  nghttp2_mem_free(mem, buf);

  if (rv != 0) {
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  return 0;
}